

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O0

bool LoadScriptFile(char *name,bool include,int type)

{
  int lump_00;
  int numnodes;
  FWadLump *lump_01;
  bool res;
  FileReader *lump;
  int lumpnum;
  int type_local;
  bool include_local;
  char *name_local;
  
  lump_00 = FWadCollection::CheckNumForName(&Wads,name);
  if (lump_00 < 0) {
    name_local._7_1_ = false;
  }
  else {
    lump_01 = FWadCollection::ReopenLumpNum(&Wads,lump_00);
    numnodes = FWadCollection::LumpLength(&Wads,lump_00);
    name_local._7_1_ = LoadScriptFile(lump_00,&lump_01->super_FileReader,numnodes,include,type);
    if (lump_01 != (FWadLump *)0x0) {
      (*(lump_01->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])();
    }
  }
  return name_local._7_1_;
}

Assistant:

bool LoadScriptFile (const char *name, bool include, int type)
{
	int lumpnum = Wads.CheckNumForName (name);
	FileReader *lump;

	if (lumpnum < 0)
	{
		return false;
	}
	lump = Wads.ReopenLumpNum (lumpnum);

	bool res = LoadScriptFile(lumpnum, lump, Wads.LumpLength(lumpnum), include, type);
	delete lump;
	return res;
}